

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

UniValue *
CreateUTXOSnapshot(NodeContext *node,Chainstate *chainstate,AutoFile *afile,path *path,path *tmppath
                  )

{
  long lVar1;
  CBlockIndex *in_RDX;
  CCoinsStats *in_RSI;
  UniValue *in_RDI;
  tuple<std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
  *in_R8;
  long in_FS_OFFSET;
  type *tip;
  type *stats;
  type *cursor;
  path *in_stack_000004f0;
  path *in_stack_000004f8;
  function<void_()> *in_stack_00000500;
  tuple<std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
  *in_stack_fffffffffffffe68;
  UniValue *afile_00;
  Chainstate *in_stack_ffffffffffffff10;
  NodeContext *in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  afile_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe68);
  CreateUTXOSnapshot::anon_class_16_2_ca12dd6b::operator()
            ((anon_class_16_2_ca12dd6b *)&stack0xffffffffffffff10);
  std::
  get<0ul,std::unique_ptr<CCoinsViewCursor,std::default_delete<CCoinsViewCursor>>,kernel::CCoinsStats,CBlockIndex_const*>
            (in_stack_fffffffffffffe68);
  std::
  get<1ul,std::unique_ptr<CCoinsViewCursor,std::default_delete<CCoinsViewCursor>>,kernel::CCoinsStats,CBlockIndex_const*>
            (in_stack_fffffffffffffe68);
  std::
  get<2ul,std::unique_ptr<CCoinsViewCursor,std::default_delete<CCoinsViewCursor>>,kernel::CCoinsStats,CBlockIndex_const*>
            (in_stack_fffffffffffffe68);
  std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>::get
            ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
             in_stack_fffffffffffffe68);
  WriteUTXOSnapshot((Chainstate *)in_stack_ffffffffffffff18,
                    (CCoinsViewCursor *)in_stack_ffffffffffffff10,in_RSI,in_RDX,(AutoFile *)afile_00
                    ,in_stack_000004f0,in_stack_000004f8,in_stack_00000500);
  std::
  tuple<std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
  ::~tuple(in_R8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue CreateUTXOSnapshot(
    node::NodeContext& node,
    Chainstate& chainstate,
    AutoFile& afile,
    const fs::path& path,
    const fs::path& tmppath)
{
    auto [cursor, stats, tip]{WITH_LOCK(::cs_main, return PrepareUTXOSnapshot(chainstate, node.rpc_interruption_point))};
    return WriteUTXOSnapshot(chainstate, cursor.get(), &stats, tip, afile, path, tmppath, node.rpc_interruption_point);
}